

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

linked_ptr<const_testing::MatcherInterface<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>_>_>
* __thiscall
testing::internal::
linked_ptr<const_testing::MatcherInterface<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>_>_>
::operator=(linked_ptr<const_testing::MatcherInterface<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>_>_>
            *this,linked_ptr<const_testing::MatcherInterface<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>_>_>
                  *ptr)

{
  if (ptr != this) {
    depart(this);
    linked_ptr<testing::MatcherInterface<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>>const>
    ::
    copy<testing::MatcherInterface<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>>const>
              ((linked_ptr<testing::MatcherInterface<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>>const>
                *)this,ptr);
  }
  return this;
}

Assistant:

linked_ptr& operator=(linked_ptr const& ptr) {
    if (&ptr != this) {
      depart();
      copy(&ptr);
    }
    return *this;
  }